

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  uint8 uVar1;
  uint8 *puVar2;
  uint uVar3;
  
  uVar3 = this->m_bits_left;
  if ((uVar3 & 7) == 0) {
    if (uVar3 == 0x10) {
      puVar2 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar2 + -1;
      puVar2[-1] = (uint8)this->m_bit_buf;
      this->m_in_buf_left = this->m_in_buf_left + 1;
      uVar3 = this->m_bits_left;
    }
    if (7 < (int)uVar3) {
      uVar1 = *(uint8 *)((long)&this->m_bit_buf + 1);
      puVar2 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar2 + -1;
      puVar2[-1] = uVar1;
      this->m_in_buf_left = this->m_in_buf_left + 1;
    }
    uVar1 = *(uint8 *)((long)&this->m_bit_buf + 2);
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = uVar1;
    this->m_in_buf_left = this->m_in_buf_left + 1;
    uVar1 = *(uint8 *)((long)&this->m_bit_buf + 3);
    puVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar2 + -1;
    puVar2[-1] = uVar1;
    this->m_in_buf_left = this->m_in_buf_left + 1;
    this->m_bits_left = 0x10;
    get_bits_no_markers(this,0x10);
    get_bits_no_markers(this,0x10);
    return;
  }
  __assert_fail("(m_bits_left & 7) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp",
                0x5c7,"void jpgd::jpeg_decoder::fix_in_buffer()");
}

Assistant:

void jpeg_decoder::fix_in_buffer()
{
  // In case any 0xFF's where pulled into the buffer during marker scanning.
  JPGD_ASSERT((m_bits_left & 7) == 0);

  if (m_bits_left == 16)
    stuff_char( (uint8)(m_bit_buf & 0xFF));

  if (m_bits_left >= 8)
    stuff_char( (uint8)((m_bit_buf >> 8) & 0xFF));

  stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
  stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}